

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEndForEachCommand.h
# Opt level: O0

cmCommand * __thiscall cmEndForEachCommand::Clone(cmEndForEachCommand *this)

{
  cmCommand *this_00;
  cmEndForEachCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmEndForEachCommand((cmEndForEachCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmEndForEachCommand;
    }